

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_spike.cpp
# Opt level: O2

int AF_A_ThrustInitUp(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  char *__assertion;
  DObject *this_00;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_00543991;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    this_00 = (DObject *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (this_00 == (DObject *)0x0) {
LAB_005438d7:
        this_00 = (DObject *)0x0;
      }
      else {
        bVar2 = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
        if (!bVar2) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_00543991;
        }
      }
      if (numparam == 1) goto LAB_00543945;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_00543981;
        this = (DObject *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (this != (DObject *)0x0) {
            bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
            if (!bVar2) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_00543991;
            }
          }
        }
        else if (this != (DObject *)0x0) goto LAB_00543981;
      }
      if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_00543945:
        *(undefined4 *)&this_00[0xf].ObjNext = 1;
        this_00[0xf]._vptr_DObject = (_func_int **)0x0;
        *(undefined8 *)&this_00[9].field_0x24 = 0xa000000002;
        *(undefined8 *)((long)&this_00[10].GCNext + 4) = 0x500000000;
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_00543991;
    }
    if (this_00 == (DObject *)0x0) goto LAB_005438d7;
  }
LAB_00543981:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_00543991:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_spike.cpp"
                ,0x51,"int AF_A_ThrustInitUp(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ThrustInitUp)
{
	PARAM_ACTION_PROLOGUE;

	self->special2 = 5;	// Raise speed
	self->args[0] = 1;		// Mark as up
	self->Floorclip = 0;
	self->flags = MF_SOLID;
	self->flags2 = MF2_NOTELEPORT|MF2_FLOORCLIP;
	self->special1 = 0L;
	return 0;
}